

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PSocket.cpp
# Opt level: O2

void __thiscall P2PSocket::~P2PSocket(P2PSocket *this)

{
  int in_ESI;
  
  SocketResource::close(&this->m_socket,in_ESI);
  SocketResource::cleanUp();
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
               *)&this->m_events);
  Peers::~Peers(&this->m_peers);
  return;
}

Assistant:

P2PSocket::~P2PSocket()
{
    m_socket.close();
    SocketResource::cleanUp();
}